

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnLocalSet(SharedValidator *this,Location *loc,Var *param_2)

{
  bool bVar1;
  Result rhs;
  Var local_88;
  Enum local_3c;
  Type local_38;
  Type type;
  Var *local_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Opcode::Opcode((Opcode *)&type,LocalSet);
  type.type_index_ = (Index)CheckInstr(this,(Opcode)type.enum_,loc);
  bVar1 = Failed((Result)type.type_index_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
    Type::Type(&local_38,Any);
    Var::Var(&local_88,param_2);
    local_3c = (Enum)CheckLocalIndex(this,&local_88,&local_38);
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_3c);
    Var::~Var(&local_88);
    rhs = TypeChecker::OnLocalSet(&this->typechecker_,local_38);
    Result::operator|=((Result *)((long)&this_local + 4),rhs);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnLocalSet(const Location& loc, Var local_var) {
  CHECK_RESULT(CheckInstr(Opcode::LocalSet, loc));
  Result result = Result::Ok;
  Type type = Type::Any;
  result |= CheckLocalIndex(local_var, &type);
  result |= typechecker_.OnLocalSet(type);
  return result;
}